

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_submit.c
# Opt level: O2

int32_t nghttp2_submit_request
                  (nghttp2_session *session,nghttp2_priority_spec *pri_spec,nghttp2_nv *nva,
                  size_t nvlen,nghttp2_data_provider *data_prd,void *stream_user_data)

{
  uint8_t uVar1;
  int iVar2;
  int32_t iVar3;
  uint8_t flags;
  
  iVar3 = -0x1f9;
  if (session->server == '\0') {
    if (((pri_spec == (nghttp2_priority_spec *)0x0) ||
        (iVar2 = nghttp2_priority_spec_check_default(pri_spec), iVar2 != 0)) ||
       ((session->remote_settings).no_rfc7540_priorities == 1)) {
      pri_spec = (nghttp2_priority_spec *)0x0;
    }
    else if (session->next_stream_id == pri_spec->stream_id) {
      return -0x1f5;
    }
    if ((data_prd == (nghttp2_data_provider *)0x0) ||
       (data_prd->read_callback == (nghttp2_data_source_read_callback)0x0)) {
      uVar1 = '\x01';
    }
    else {
      uVar1 = '\0';
    }
    flags = uVar1 + ' ';
    if (pri_spec == (nghttp2_priority_spec *)0x0) {
      flags = uVar1;
    }
    iVar3 = submit_headers_shared_nva(session,flags,-1,pri_spec,nva,nvlen,data_prd,stream_user_data)
    ;
  }
  return iVar3;
}

Assistant:

int32_t nghttp2_submit_request(nghttp2_session *session,
                               const nghttp2_priority_spec *pri_spec,
                               const nghttp2_nv *nva, size_t nvlen,
                               const nghttp2_data_provider *data_prd,
                               void *stream_user_data) {
  uint8_t flags;
  int rv;

  if (session->server) {
    return NGHTTP2_ERR_PROTO;
  }

  if (pri_spec && !nghttp2_priority_spec_check_default(pri_spec) &&
      session->remote_settings.no_rfc7540_priorities != 1) {
    rv = detect_self_dependency(session, -1, pri_spec);
    if (rv != 0) {
      return rv;
    }
  } else {
    pri_spec = NULL;
  }

  flags = set_request_flags(pri_spec, data_prd);

  return submit_headers_shared_nva(session, flags, -1, pri_spec, nva, nvlen,
                                   data_prd, stream_user_data);
}